

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

IntResult * __thiscall
slang::parsing::NumberParser::reportMissingDigits
          (IntResult *__return_storage_ptr__,NumberParser *this,Token sizeToken,Token baseToken,
          Token first)

{
  Token base;
  Token size;
  NumberParser *pNVar1;
  undefined8 uVar2;
  Info *pIVar3;
  bool bVar4;
  size_type delta;
  Token value;
  string_view local_60;
  SourceLocation local_50;
  SourceLocation local_48;
  SourceLocation local_40;
  SourceLocation local_38;
  SourceLocation errLoc;
  NumberParser *this_local;
  Token baseToken_local;
  Token sizeToken_local;
  
  baseToken_local._0_8_ = baseToken.info;
  this_local = baseToken._0_8_;
  baseToken_local.info = sizeToken._0_8_;
  errLoc = (SourceLocation)this;
  SourceLocation::SourceLocation(&local_38);
  bVar4 = Token::operator_cast_to_bool(&first);
  if ((bVar4) && (first.kind != EndOfFile)) {
    local_40 = Token::location(&first);
    local_38 = local_40;
  }
  else {
    local_50 = Token::location((Token *)&this_local);
    local_60 = Token::rawText((Token *)&this_local);
    delta = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_60);
    local_48 = SourceLocation::operator+(&local_50,delta);
    local_38 = local_48;
  }
  addDiag(this,(DiagCode)0x3,local_38);
  pIVar3 = baseToken_local.info;
  uVar2 = baseToken_local._0_8_;
  pNVar1 = this_local;
  value = Token::createMissing(this->alloc,IntegerLiteral,local_38);
  size.info = sizeToken.info;
  size._0_8_ = pIVar3;
  base.info = (Info *)uVar2;
  base._0_8_ = pNVar1;
  IntResult::vector(__return_storage_ptr__,size,base,value);
  return __return_storage_ptr__;
}

Assistant:

NumberParser::IntResult NumberParser::reportMissingDigits(Token sizeToken, Token baseToken,
                                                          Token first) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    SourceLocation errLoc;
    if (first && first.kind != TokenKind::EndOfFile)
        errLoc = first.location();
    else
        errLoc = baseToken.location() + baseToken.rawText().size();

    addDiag(diag::ExpectedVectorDigits, errLoc);
    return IntResult::vector(sizeToken, baseToken,
                             Token::createMissing(alloc, TokenKind::IntegerLiteral, errLoc));
}